

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::StoreAnimations
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pPrefix)

{
  pointer ppAVar1;
  string animName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (pPrefix->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_70,(string *)pSrcAnim);
  }
  else {
    std::operator+(&local_50,pPrefix,"_");
    std::operator+(&local_70,&local_50,&pSrcAnim->mName);
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (ppAVar1 = (pSrcAnim->mSubAnims).
                 super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppAVar1 !=
      (pSrcAnim->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
    StoreAnimations(this,pScene,pParser,*ppAVar1,&local_70);
  }
  if ((pSrcAnim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pSrcAnim->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CreateAnimation(this,pScene,pParser,pSrcAnim,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void ColladaLoader::StoreAnimations(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string &pPrefix)
{
    std::string animName = pPrefix.empty() ? pSrcAnim->mName : pPrefix + "_" + pSrcAnim->mName;

    // create nested animations, if given
    for (std::vector<Collada::Animation*>::const_iterator it = pSrcAnim->mSubAnims.begin(); it != pSrcAnim->mSubAnims.end(); ++it)
        StoreAnimations(pScene, pParser, *it, animName);

    // create animation channels, if any
    if (!pSrcAnim->mChannels.empty())
        CreateAnimation(pScene, pParser, pSrcAnim, animName);
}